

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::MultiThreadedObjectTest::pullObjectsFromShared
          (MultiThreadedObjectTest *this,TestThread *thread,int pbufferCount,int pixmapCount,
          int windowCount,int contextCount)

{
  int iVar1;
  Random *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  vector<void_*,_std::allocator<void_*>_> *this_01;
  bool bVar5;
  
  iVar1 = thread->m_id;
  bVar5 = iVar1 == 0;
  lVar2 = 0x170;
  if (bVar5) {
    lVar2 = 0x158;
  }
  lVar3 = 0x128;
  if (bVar5) {
    lVar3 = 0x110;
  }
  lVar4 = 0x200;
  if (bVar5) {
    lVar4 = 0x1e8;
  }
  this_01 = &this->m_pbuffers1;
  if (iVar1 == 0) {
    this_01 = &this->m_pbuffers0;
  }
  this_00 = &this->m_rnd0 + (iVar1 != 0);
  if (pbufferCount < 1) {
    pbufferCount = 0;
  }
  while (bVar5 = pbufferCount != 0, pbufferCount = pbufferCount + -1, bVar5) {
    iVar1 = de::Random::getInt(this_00,0,
                               (int)((ulong)((long)(this->m_sharedPbuffers).
                                                                                                      
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_sharedPbuffers).
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               -1);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (this_01,(this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + iVar1);
    std::vector<void_*,_std::allocator<void_*>_>::erase
              (&this->m_sharedPbuffers,
               (const_iterator)
               ((this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start + iVar1));
  }
  if (pixmapCount < 1) {
    pixmapCount = 0;
  }
  while (bVar5 = pixmapCount != 0, pixmapCount = pixmapCount + -1, bVar5) {
    iVar1 = de::Random::getInt(this_00,0,
                               (int)((ulong)((long)(this->m_sharedNativePixmaps).
                                                                                                      
                                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_sharedNativePixmaps).
                                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) +
                               -1);
    std::
    vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ::push_back((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar3),
                (this->m_sharedNativePixmaps).
                super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar1);
    std::
    vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ::erase(&this->m_sharedNativePixmaps,
            (this->m_sharedNativePixmaps).
            super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start + iVar1);
  }
  if (windowCount < 1) {
    windowCount = 0;
  }
  while (windowCount != 0) {
    iVar1 = de::Random::getInt(this_00,0,
                               (int)((ulong)((long)(this->m_sharedNativeWindows).
                                                                                                      
                                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_sharedNativeWindows).
                                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) +
                               -1);
    std::
    vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ::push_back((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar2),
                (this->m_sharedNativeWindows).
                super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar1);
    std::
    vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ::erase(&this->m_sharedNativeWindows,
            (this->m_sharedNativeWindows).
            super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start + iVar1);
    windowCount = windowCount + -1;
  }
  if (contextCount < 1) {
    contextCount = 0;
  }
  while (bVar5 = contextCount != 0, contextCount = contextCount + -1, bVar5) {
    iVar1 = de::Random::getInt(this_00,0,
                               (int)((ulong)((long)(this->m_sharedContexts).
                                                                                                      
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_sharedContexts).
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               -1);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)
               ((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                       _vptr_TestNode + lVar4),
               (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1);
    std::vector<void_*,_std::allocator<void_*>_>::erase
              (&this->m_sharedContexts,
               (const_iterator)
               ((this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start + iVar1));
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pullObjectsFromShared (TestThread& thread, int pbufferCount, int pixmapCount, int windowCount, int contextCount)
{
	de::Random&											rnd			= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < pbufferCount; pbufferNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedPbuffers.size()-1));

		pbuffers.push_back(m_sharedPbuffers[ndx]);
		m_sharedPbuffers.erase(m_sharedPbuffers.begin() + ndx);
	}

	for (int pixmapNdx = 0; pixmapNdx < pixmapCount; pixmapNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1));

		pixmaps.push_back(m_sharedNativePixmaps[ndx]);
		m_sharedNativePixmaps.erase(m_sharedNativePixmaps.begin() + ndx);
	}

	for (int windowNdx = 0; windowNdx < windowCount; windowNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1));

		windows.push_back(m_sharedNativeWindows[ndx]);
		m_sharedNativeWindows.erase(m_sharedNativeWindows.begin() + ndx);
	}

	for (int contextNdx = 0; contextNdx < contextCount; contextNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedContexts.size()-1));

		contexts.push_back(m_sharedContexts[ndx]);
		m_sharedContexts.erase(m_sharedContexts.begin() + ndx);
	}
}